

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

satoko_t * satoko_create(void)

{
  satoko_t *psVar1;
  vec_uint_t *pvVar2;
  cdb *pcVar3;
  vec_wl_t *pvVar4;
  vec_sdbl_t *pvVar5;
  heap_t *phVar6;
  vec_char_t *pvVar7;
  b_queue_t *pbVar8;
  solver_t *s;
  
  psVar1 = (satoko_t *)calloc(1,0x1e8);
  satoko_default_opts(&psVar1->opts);
  psVar1->status = 1;
  pvVar2 = vec_uint_alloc(0);
  psVar1->assumptions = pvVar2;
  pvVar2 = vec_uint_alloc(0);
  psVar1->final_conflict = pvVar2;
  pcVar3 = cdb_alloc(0);
  psVar1->all_clauses = pcVar3;
  pvVar2 = vec_uint_alloc(0);
  psVar1->originals = pvVar2;
  pvVar2 = vec_uint_alloc(0);
  psVar1->learnts = pvVar2;
  pvVar4 = vec_wl_alloc(0);
  psVar1->watches = pvVar4;
  psVar1->var_act_inc = SDBL_CONST1;
  psVar1->clause_act_inc = 0x800;
  pvVar5 = vec_sdbl_alloc(0);
  psVar1->activity = pvVar5;
  phVar6 = heap_alloc(psVar1->activity);
  psVar1->var_order = phVar6;
  pvVar2 = vec_uint_alloc(0);
  psVar1->levels = pvVar2;
  pvVar2 = vec_uint_alloc(0);
  psVar1->reasons = pvVar2;
  pvVar7 = vec_char_alloc(0);
  psVar1->assigns = pvVar7;
  pvVar7 = vec_char_alloc(0);
  psVar1->polarity = pvVar7;
  pvVar2 = vec_uint_alloc(0);
  psVar1->trail = pvVar2;
  pvVar2 = vec_uint_alloc(0);
  psVar1->trail_lim = pvVar2;
  pbVar8 = b_queue_alloc((psVar1->opts).sz_trail_bqueue);
  psVar1->bq_trail = pbVar8;
  pbVar8 = b_queue_alloc((psVar1->opts).sz_lbd_bqueue);
  psVar1->bq_lbd = pbVar8;
  psVar1->n_confl_bfr_reduce = (ulong)(psVar1->opts).n_conf_fst_reduce;
  psVar1->RC1 = 1;
  psVar1->RC2 = (ulong)(psVar1->opts).n_conf_fst_reduce;
  pvVar2 = vec_uint_alloc(0);
  psVar1->temp_lits = pvVar2;
  pvVar7 = vec_char_alloc(0);
  psVar1->seen = pvVar7;
  pvVar2 = vec_uint_alloc(0);
  psVar1->tagged = pvVar2;
  pvVar2 = vec_uint_alloc(0);
  psVar1->stack = pvVar2;
  pvVar2 = vec_uint_alloc(0);
  psVar1->last_dlevel = pvVar2;
  pvVar2 = vec_uint_alloc(0);
  psVar1->stamps = pvVar2;
  return psVar1;
}

Assistant:

solver_t * satoko_create()
{
    solver_t *s = satoko_calloc(solver_t, 1);

    satoko_default_opts(&s->opts);
    s->status = SATOKO_OK;
    /* User data */
    s->assumptions = vec_uint_alloc(0);
    s->final_conflict = vec_uint_alloc(0);
    /* Clauses Database */
    s->all_clauses = cdb_alloc(0);
    s->originals = vec_uint_alloc(0);
    s->learnts = vec_uint_alloc(0);
    s->watches = vec_wl_alloc(0);
    /* Activity heuristic */
    s->var_act_inc = VAR_ACT_INIT_INC;
    s->clause_act_inc = CLAUSE_ACT_INIT_INC;
    /* Variable Information */
    s->activity = vec_act_alloc(0);
    s->var_order = heap_alloc(s->activity);
    s->levels = vec_uint_alloc(0);
    s->reasons = vec_uint_alloc(0);
    s->assigns = vec_char_alloc(0);
    s->polarity = vec_char_alloc(0);
    /* Assignments */
    s->trail = vec_uint_alloc(0);
    s->trail_lim = vec_uint_alloc(0);
    /* Temporary data used by Search method */
    s->bq_trail = b_queue_alloc(s->opts.sz_trail_bqueue);
    s->bq_lbd = b_queue_alloc(s->opts.sz_lbd_bqueue);
    s->n_confl_bfr_reduce = s->opts.n_conf_fst_reduce;
    s->RC1 = 1;
    s->RC2 = s->opts.n_conf_fst_reduce;
    /* Temporary data used by Analyze */
    s->temp_lits = vec_uint_alloc(0);
    s->seen = vec_char_alloc(0);
    s->tagged = vec_uint_alloc(0);
    s->stack = vec_uint_alloc(0);
    s->last_dlevel = vec_uint_alloc(0);
    /* Misc temporary */
    s->stamps = vec_uint_alloc(0);
    return s;
}